

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTypePtr xmlSchemaGetPrimitiveType(xmlSchemaTypePtr type)

{
  xmlSchemaTypePtr local_18;
  xmlSchemaTypePtr type_local;
  
  local_18 = type;
  while( true ) {
    if (local_18 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    if ((local_18->builtInType == 0x2e) || ((local_18->flags & 0x4000U) != 0)) break;
    local_18 = local_18->baseType;
  }
  return local_18;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaGetPrimitiveType(xmlSchemaTypePtr type)
{

    while (type != NULL) {
	/*
	* Note that anySimpleType is actually not a primitive type
	* but we need that here.
	*/
	if ((type->builtInType == XML_SCHEMAS_ANYSIMPLETYPE) ||
	   (type->flags & XML_SCHEMAS_TYPE_BUILTIN_PRIMITIVE))
	    return (type);
	type = type->baseType;
    }

    return (NULL);
}